

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpUtils.cpp
# Opt level: O0

HighsStatus readBasisFile(HighsLogOptions *log_options,HighsBasis *basis,string *filename)

{
  byte bVar1;
  _Ios_Openmode _Var2;
  undefined8 uVar3;
  HighsLogOptions *in_RDI;
  ifstream in_file;
  HighsStatus return_status;
  char local_228 [160];
  ifstream *in_stack_fffffffffffffe78;
  HighsBasis *in_stack_fffffffffffffe80;
  HighsLogOptions *in_stack_fffffffffffffe88;
  HighsStatus local_1c;
  
  std::ifstream::ifstream(local_228);
  _Var2 = std::__cxx11::string::c_str();
  std::ifstream::open(local_228,_Var2);
  bVar1 = std::ifstream::is_open();
  if ((bVar1 & 1) == 0) {
    uVar3 = std::__cxx11::string::c_str();
    highsLogUser(in_RDI,kError,"readBasisFile: Cannot open readable file \"%s\"\n",uVar3);
    local_1c = kError;
  }
  else {
    local_1c = readBasisStream(in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,
                               in_stack_fffffffffffffe78);
    std::ifstream::close();
  }
  std::ifstream::~ifstream(local_228);
  return local_1c;
}

Assistant:

HighsStatus readBasisFile(const HighsLogOptions& log_options, HighsBasis& basis,
                          const std::string filename) {
  // Opens a basis file as an ifstream
  HighsStatus return_status = HighsStatus::kOk;
  std::ifstream in_file;
  in_file.open(filename.c_str(), std::ios::in);
  if (in_file.is_open()) {
    return_status = readBasisStream(log_options, basis, in_file);
    in_file.close();
  } else {
    highsLogUser(log_options, HighsLogType::kError,
                 "readBasisFile: Cannot open readable file \"%s\"\n",
                 filename.c_str());
    return_status = HighsStatus::kError;
  }
  return return_status;
}